

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O1

bool __thiscall MipsElfFile::setSection(MipsElfFile *this,string *name)

{
  pointer ppEVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  bool bVar5;
  
  ppEVar1 = (this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  bVar5 = (this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppEVar1;
  if (bVar5) {
    iVar2 = ElfSegment::findSection(*ppEVar1,name);
    if (iVar2 == -1) {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      do {
        ppEVar1 = (this->elf).segments.
                  super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)(this->elf).segments.
                        super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3);
        bVar5 = pbVar4 < in_RCX;
        if (!bVar5) goto LAB_00181766;
        iVar2 = ElfSegment::findSection(ppEVar1[(long)pbVar4],name);
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pbVar4->_M_dataplus)._M_p + 1);
      } while (iVar2 == -1);
      iVar3 = (int)pbVar4 + -1;
    }
    else {
      iVar3 = 0;
    }
    this->segment = iVar3;
    this->section = iVar2;
    if (bVar5) {
      return true;
    }
  }
LAB_00181766:
  iVar2 = ElfFile::findSegmentlessSection(&this->elf,name);
  if (iVar2 == -1) {
    Logger::queueError<std::__cxx11::string>((Logger *)0x0,0x193244,(char *)name,in_RCX);
  }
  else {
    this->segment = -1;
    this->section = iVar2;
  }
  return iVar2 != -1;
}

Assistant:

bool MipsElfFile::setSection(const std::string& name)
{
	// look in segments
	for (size_t i = 0; i < elf.getSegmentCount(); i++)
	{
		ElfSegment* seg = elf.getSegment(i);
		int n = seg->findSection(name);
		if (n != -1)
		{
			segment = (int) i;
			section = n;
			return true;
		}
	}

	// look in stray sections
	int n = elf.findSegmentlessSection(name);
	if (n != -1)
	{
		segment = -1;
		section = n;
		return true;
	}

	Logger::queueError(Logger::Warning, "Section %s not found",name);
	return false;
}